

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O3

void commit_h_x4(uint8_t **digest,commitments_t *C,picnic_instance_t *params)

{
  uint capacity;
  ulong uVar1;
  uint rate;
  hash_context_x4 ctx;
  uint8_t *local_388;
  uint8_t *local_380;
  uint8_t *local_378;
  uint8_t *local_370;
  Keccak_HashInstancetimes4 local_368;
  
  if (params->digest_size == ' ') {
    rate = 0x540;
    capacity = 0x100;
  }
  else {
    rate = 0x440;
    capacity = 0x200;
  }
  Keccak_HashInitializetimes4(&local_368,rate,capacity,0,'\x1f');
  if (params->num_MPC_parties != '\0') {
    uVar1 = 0;
    do {
      local_378 = C[2].hashes[uVar1];
      local_388 = C->hashes[uVar1];
      local_380 = C[1].hashes[uVar1];
      local_370 = C[3].hashes[uVar1];
      Keccak_HashUpdatetimes4(&local_368,&local_388,(ulong)params->digest_size << 3);
      uVar1 = uVar1 + 1;
    } while (uVar1 < params->num_MPC_parties);
  }
  Keccak_HashFinaltimes4(&local_368,(BitSequence **)0x0);
  Keccak_HashSqueezetimes4(&local_368,digest,(ulong)params->digest_size << 3);
  return;
}

Assistant:

static void commit_h_x4(uint8_t** digest, const commitments_t* C, const picnic_instance_t* params) {
  hash_context_x4 ctx;

  hash_init_x4(&ctx, params->digest_size);
  for (size_t i = 0; i < params->num_MPC_parties; i++) {
    hash_update_x4_4(&ctx, C[0].hashes[i], C[1].hashes[i], C[2].hashes[i], C[3].hashes[i],
                     params->digest_size);
  }
  hash_final_x4(&ctx);
  hash_squeeze_x4(&ctx, digest, params->digest_size);
  hash_clear_x4(&ctx);
}